

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDriverGetExtensionFunctionAddressPrologue
          (ZEParameterValidation *this,ze_driver_handle_t hDriver,char *name,
          void **ppFunctionAddress)

{
  ze_result_t zVar1;
  
  if (hDriver == (ze_driver_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (name != (char *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (ppFunctionAddress != (void **)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDriverGetExtensionFunctionAddressPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char* name,                               ///< [in] extension function name
        void** ppFunctionAddress                        ///< [out] pointer to function pointer
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == name )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == ppFunctionAddress )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }